

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgkyn(fitsfile *fptr,int nkey,char *keyname,char *value,char *comm,int *status)

{
  int iVar1;
  int local_fc;
  char local_f8 [4];
  int namelen;
  char sbuff [81];
  char local_98 [8];
  char card [81];
  int *status_local;
  char *comm_local;
  char *value_local;
  char *keyname_local;
  int nkey_local;
  fitsfile *fptr_local;
  
  *keyname = '\0';
  *value = '\0';
  if (comm != (char *)0x0) {
    *comm = '\0';
  }
  if (*status < 1) {
    unique0x100000ee = status;
    iVar1 = ffgrec(fptr,nkey,local_98,status);
    if (iVar1 < 1) {
      ffgknm(local_98,keyname,&local_fc,stack0xffffffffffffffc0);
      iVar1 = ffpsvc(local_98,value,comm,stack0xffffffffffffffc0);
      if (iVar1 < 1) {
        iVar1 = fftrec(keyname,stack0xffffffffffffffc0);
        if (0 < iVar1) {
          snprintf(local_f8,0x51,"Name of keyword no. %d contains illegal character(s): %s",
                   (ulong)(uint)nkey,keyname);
          ffpmsg(local_f8);
          if (nkey % 0x24 == 0) {
            ffpmsg("  (This may indicate a missing END keyword).");
          }
        }
        fptr_local._4_4_ = *stack0xffffffffffffffc0;
      }
      else {
        fptr_local._4_4_ = *stack0xffffffffffffffc0;
      }
    }
    else {
      fptr_local._4_4_ = *stack0xffffffffffffffc0;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgkyn( fitsfile *fptr,      /* I - FITS file pointer             */
            int    nkey,         /* I - number of the keyword to read */
            char   *keyname,     /* O - name of the keyword           */
            char   *value,       /* O - keyword value                 */
            char   *comm,        /* O - keyword comment               */
            int    *status)      /* IO - error status                 */
/*
  Read (get) the nkey-th keyword returning the keyword name, value and comment.
  The value is just the literal string of characters in the value field
  of the keyword.  In the case of a string valued keyword, the returned
  value includes the leading and closing quote characters.  The value may be
  up to 70 characters long, and the comment may be up to 72 characters long.
  If the keyword has no value (no equal sign in column 9) then a null value
  is returned.  If comm = NULL, then do not return the comment string.
*/
{
    char card[FLEN_CARD], sbuff[FLEN_CARD];
    int namelen;

    keyname[0] = '\0';
    value[0] = '\0';
    if (comm)
        comm[0] = '\0';

    if (*status > 0)
        return(*status);

    if (ffgrec(fptr, nkey, card, status) > 0 )  /* get the 80-byte card */
        return(*status);

    ffgknm(card, keyname, &namelen, status); /* get the keyword name */

    if (ffpsvc(card, value, comm, status) > 0)   /* parse value and comment */
        return(*status);

    if (fftrec(keyname, status) > 0)  /* test keyword name; catches no END */
    {
     snprintf(sbuff, FLEN_CARD, "Name of keyword no. %d contains illegal character(s): %s",
              nkey, keyname);
     ffpmsg(sbuff);

     if (nkey % 36 == 0)  /* test if at beginning of 36-card FITS record */
            ffpmsg("  (This may indicate a missing END keyword).");
    }
    return(*status);
}